

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O2

void __thiscall QStatusBar::removeWidget(QStatusBar *this,QWidget *widget)

{
  QList<QStatusBarPrivate::SBItem> *this_00;
  long lVar1;
  long *plVar2;
  int iVar3;
  ItemCategory IVar4;
  iterator aend;
  iterator iVar5;
  SBItem *pSVar6;
  SBItem *pSVar7;
  long *plVar8;
  long *plVar9;
  long lVar10;
  long lVar11;
  const_iterator abegin;
  
  if (widget == (QWidget *)0x0) {
    return;
  }
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  this_00 = (QList<QStatusBarPrivate::SBItem> *)(lVar1 + 600);
  plVar2 = *(long **)(lVar1 + 0x260);
  lVar1 = *(long *)(lVar1 + 0x268);
  lVar10 = lVar1 * 0x10;
  plVar8 = plVar2;
  for (lVar11 = lVar1 >> 2; 0 < lVar11; lVar11 = lVar11 + -1) {
    plVar9 = plVar8;
    if ((QWidget *)*plVar8 == widget) goto LAB_0044b6df;
    if ((QWidget *)plVar8[2] == widget) {
      plVar9 = plVar8 + 2;
      goto LAB_0044b6df;
    }
    if ((QWidget *)plVar8[4] == widget) {
      plVar9 = plVar8 + 4;
      goto LAB_0044b6df;
    }
    if ((QWidget *)plVar8[6] == widget) {
      plVar9 = plVar8 + 6;
      goto LAB_0044b6df;
    }
    plVar8 = plVar8 + 8;
    lVar10 = lVar10 + -0x40;
  }
  lVar10 = lVar10 >> 4;
  if (lVar10 != 1) {
    if (lVar10 != 2) {
      plVar9 = plVar2 + lVar1 * 2;
      if ((lVar10 != 3) || (plVar9 = plVar8, (QWidget *)*plVar8 == widget)) goto LAB_0044b6df;
      plVar8 = plVar8 + 2;
    }
    plVar9 = plVar8;
    if ((QWidget *)*plVar8 == widget) goto LAB_0044b6df;
    plVar8 = plVar8 + 2;
  }
  plVar9 = plVar2 + lVar1 * 2;
  if ((QWidget *)*plVar8 == widget) {
    plVar9 = plVar8;
  }
LAB_0044b6df:
  if ((long)plVar9 - (long)plVar2 >> 4 != lVar1) {
    aend = QList<QStatusBarPrivate::SBItem>::end(this_00);
    iVar5 = QList<QStatusBarPrivate::SBItem>::begin(this_00);
    abegin.i = iVar5.i + ((long)plVar9 - (long)plVar2);
    pSVar6 = abegin.i;
    while (pSVar7 = pSVar6, pSVar6 = pSVar7 + 1, pSVar6 != aend.i) {
      if (pSVar6->widget != widget) {
        iVar3 = pSVar7[1].stretch;
        IVar4 = pSVar7[1].category;
        (abegin.i)->widget = pSVar6->widget;
        (abegin.i)->stretch = iVar3;
        (abegin.i)->category = IVar4;
        abegin.i = abegin.i + 1;
      }
    }
    QList<QStatusBarPrivate::SBItem>::erase(this_00,abegin,(const_iterator)aend.i);
    if (aend.i != abegin.i) {
      QWidget::hide(widget);
      reformat(this);
      return;
    }
  }
  return;
}

Assistant:

void QStatusBar::removeWidget(QWidget *widget)
{
    if (!widget)
        return;

    Q_D(QStatusBar);
    if (d->items.removeIf([widget](const auto &item) { return item.widget == widget; })) {
        widget->hide();
        reformat();
    }
#if defined(QT_DEBUG)
    else
        qDebug("QStatusBar::removeWidget(): Widget not found.");
#endif
}